

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O0

FString __thiscall DArgs::TakeValue(DArgs *this,char *check)

{
  uint index;
  uint uVar1;
  FString *pFVar2;
  char *pcVar3;
  char *in_RDX;
  int i;
  char *check_local;
  DArgs *this_local;
  FString *out;
  
  index = CheckParm((DArgs *)check,in_RDX,1);
  FString::FString((FString *)this);
  if ((0 < (int)index) &&
     (uVar1 = TArray<FString,_FString>::Size((TArray<FString,_FString> *)(check + 0x28)),
     (int)index < (int)uVar1)) {
    uVar1 = TArray<FString,_FString>::Size((TArray<FString,_FString> *)(check + 0x28));
    if ((int)index < (int)(uVar1 - 1)) {
      pFVar2 = TArray<FString,_FString>::operator[]
                         ((TArray<FString,_FString> *)(check + 0x28),(long)(int)(index + 1));
      pcVar3 = FString::operator[](pFVar2,0);
      if (*pcVar3 != '+') {
        pFVar2 = TArray<FString,_FString>::operator[]
                           ((TArray<FString,_FString> *)(check + 0x28),(long)(int)(index + 1));
        pcVar3 = FString::operator[](pFVar2,0);
        if (*pcVar3 != '-') {
          pFVar2 = TArray<FString,_FString>::operator[]
                             ((TArray<FString,_FString> *)(check + 0x28),(long)(int)(index + 1));
          FString::operator=((FString *)this,pFVar2);
          TArray<FString,_FString>::Delete((TArray<FString,_FString> *)(check + 0x28),index,2);
          return (FString)(char *)this;
        }
      }
    }
    TArray<FString,_FString>::Delete((TArray<FString,_FString> *)(check + 0x28),index);
  }
  return (FString)(char *)this;
}

Assistant:

FString DArgs::TakeValue(const char *check)
{
	int i = CheckParm(check);
	FString out;

	if (i > 0 && i < (int)Argv.Size())
	{
		if (i < (int)Argv.Size() - 1 && Argv[i+1][0] != '+' && Argv[i+1][0] != '-')
		{
			out = Argv[i+1];
			Argv.Delete(i, 2);	// Delete the parm and its value.
		}
		else
		{
			Argv.Delete(i);		// Just delete the parm, since it has no value.
		}
	}
	return out;
}